

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O1

void __thiscall b_tree_node::b_tree_node(b_tree_node *this,pager *p,int64_t ofs)

{
  int64_t *piVar1;
  ushort *puVar2;
  runtime_error *prVar3;
  ulong uVar4;
  
  this->_p = p;
  this->_ofs_field = ofs;
  pager::map_page_from(&this->_mm,p,ofs);
  if (ofs == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Unable to create b_tree_node from offset 0");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = (ushort *)(this->_mm)._mem;
  if (puVar2 != (ushort *)0x0) {
    this->_min_degree_field = puVar2;
    this->_leaf_field = puVar2 + 1;
    this->_num_keys_field = puVar2 + 2;
    this->_keys_field = (int64_t *)(puVar2 + 3);
    uVar4 = (ulong)*puVar2;
    this->_valid_keys_field = (uint8_t *)(puVar2 + uVar4 * 8 + -1);
    piVar1 = (int64_t *)((long)(puVar2 + uVar4 * 8 + -1) + uVar4 * 2 + -1);
    this->_vals_field = piVar1;
    this->_child_ofs_field = piVar1 + uVar4 * 2 + -1;
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Unable to map default constructed memory map.");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

b_tree_node::b_tree_node(const pager& p, int64_t ofs) :
    _p(p),
    _ofs_field(ofs),
    _mm(_p.map_page_from(_ofs_field))
{
    if(ofs == 0)
        throw runtime_error("Unable to create b_tree_node from offset 0");

    auto read_ptr = _mm.map().first;

    _min_degree_field = (uint16_t*)read_ptr;
    read_ptr += sizeof(uint16_t);

    _leaf_field = (uint16_t*)read_ptr;
    read_ptr += sizeof(uint16_t);

    _num_keys_field = (uint16_t*)read_ptr;
    read_ptr += sizeof(uint16_t);

    _keys_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _valid_keys_field = (uint8_t*)read_ptr;
    read_ptr += sizeof(uint8_t) * ((*_min_degree_field * 2) - 1);

    _vals_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _child_ofs_field = (int64_t*)read_ptr;
}